

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void shift128ExtraRightJamming
               (uint64_t a0,uint64_t a1,uint64_t a2,int count,uint64_t *z0Ptr,uint64_t *z1Ptr,
               uint64_t *z2Ptr)

{
  byte bVar1;
  byte bVar2;
  undefined8 local_60;
  uint64_t uStack_50;
  int8_t negCount;
  uint64_t z2;
  uint64_t z1;
  uint64_t z0;
  uint64_t *z1Ptr_local;
  uint64_t *z0Ptr_local;
  uint64_t uStack_20;
  int count_local;
  uint64_t a2_local;
  uint64_t a1_local;
  uint64_t a0_local;
  
  bVar1 = (byte)count;
  bVar2 = -bVar1 & 0x3f;
  uStack_50 = a2;
  z2 = a1;
  z1 = a0;
  if (count != 0) {
    uStack_20 = a2;
    if (count < 0x40) {
      uStack_50 = a1 << bVar2;
      z2 = a0 << bVar2 | a1 >> (bVar1 & 0x3f);
      z1 = a0 >> (bVar1 & 0x3f);
    }
    else {
      uStack_50 = a1;
      z2 = a0;
      if (count != 0x40) {
        uStack_20 = a1 | a2;
        if (count < 0x80) {
          uStack_50 = a0 << bVar2;
          z2 = a0 >> (bVar1 & 0x3f);
        }
        else {
          local_60 = a0;
          if (count != 0x80) {
            local_60 = (uint64_t)(int)(uint)(a0 != 0);
          }
          uStack_50 = local_60;
          z2 = 0;
        }
      }
      z1 = 0;
    }
    uStack_50 = (long)(int)(uint)(uStack_20 != 0) | uStack_50;
  }
  *z2Ptr = uStack_50;
  *z1Ptr = z2;
  *z0Ptr = z1;
  return;
}

Assistant:

static inline void
 shift128ExtraRightJamming(
     uint64_t a0,
     uint64_t a1,
     uint64_t a2,
     int count,
     uint64_t *z0Ptr,
     uint64_t *z1Ptr,
     uint64_t *z2Ptr
 )
{
    uint64_t z0, z1, z2;
    int8_t negCount = ( - count ) & 63;

    if ( count == 0 ) {
        z2 = a2;
        z1 = a1;
        z0 = a0;
    }
    else {
        if ( count < 64 ) {
            z2 = a1<<negCount;
            z1 = ( a0<<negCount ) | ( a1>>count );
            z0 = a0>>count;
        }
        else {
            if ( count == 64 ) {
                z2 = a1;
                z1 = a0;
            }
            else {
                a2 |= a1;
                if ( count < 128 ) {
                    z2 = a0<<negCount;
                    z1 = a0>>( count & 63 );
                }
                else {
                    z2 = ( count == 128 ) ? a0 : ( a0 != 0 );
                    z1 = 0;
                }
            }
            z0 = 0;
        }
        z2 |= ( a2 != 0 );
    }
    *z2Ptr = z2;
    *z1Ptr = z1;
    *z0Ptr = z0;

}